

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue JS_ReadModule(BCReaderState *s)

{
  int *piVar1;
  JSContext *ctx;
  int iVar2;
  ulong uVar3;
  JSModuleDef *m;
  JSReqModuleEntry *pJVar4;
  JSExportEntry *pJVar5;
  JSStarExportEntry *pJVar6;
  JSImportEntry *pJVar7;
  int *piVar8;
  ulong uVar9;
  long lVar10;
  uint32_t *pval;
  uint uVar11;
  long lVar12;
  JSRefCountHeader *p;
  int64_t iVar13;
  JSValue JVar14;
  uint8_t v8;
  JSAtom module_name;
  byte local_49;
  int *local_48;
  JSAtom local_3c;
  int *local_38;
  
  ctx = s->ctx;
  iVar2 = bc_get_atom(s,&local_3c);
  if (iVar2 == 0) {
    m = js_new_module_def(ctx,local_3c);
    if (m == (JSModuleDef *)0x0) goto LAB_0013ecde;
    (m->header).ref_count = (m->header).ref_count + 1;
    piVar1 = &m->req_module_entries_count;
    iVar2 = bc_get_leb128(s,(uint32_t *)piVar1);
    if (iVar2 == 0) {
      iVar2 = *piVar1;
      if ((long)iVar2 != 0) {
        m->req_module_entries_size = iVar2;
        pJVar4 = (JSReqModuleEntry *)js_mallocz(ctx,(long)iVar2 << 4);
        m->req_module_entries = pJVar4;
        if (pJVar4 == (JSReqModuleEntry *)0x0) goto LAB_0013ece1;
        if (0 < *piVar1) {
          lVar12 = 0;
          lVar10 = 0;
          do {
            iVar2 = bc_get_atom(s,(JSAtom *)((long)&m->req_module_entries->module_name + lVar12));
            if (iVar2 != 0) goto LAB_0013ece1;
            lVar10 = lVar10 + 1;
            lVar12 = lVar12 + 0x10;
          } while (lVar10 < *piVar1);
        }
      }
      piVar1 = &m->export_entries_count;
      iVar2 = bc_get_leb128(s,(uint32_t *)piVar1);
      if (iVar2 == 0) {
        iVar2 = *piVar1;
        if ((long)iVar2 != 0) {
          m->export_entries_size = iVar2;
          pJVar5 = (JSExportEntry *)js_mallocz(ctx,(long)iVar2 << 5);
          m->export_entries = pJVar5;
          if (pJVar5 == (JSExportEntry *)0x0) goto LAB_0013ece1;
          if (0 < *piVar1) {
            lVar10 = 0x18;
            piVar8 = (int *)0x0;
            local_38 = piVar1;
            do {
              pJVar5 = m->export_entries;
              local_48 = piVar8;
              iVar2 = bc_get_u8(s,&local_49);
              if (iVar2 != 0) goto LAB_0013ece1;
              pval = (uint32_t *)(lVar10 + -0x18 + (long)pJVar5);
              uVar11 = (uint)local_49;
              pval[4] = uVar11;
              iVar2 = bc_get_leb128(s,pval);
              if (uVar11 != 0) {
                if (iVar2 != 0) goto LAB_0013ece1;
                iVar2 = bc_get_atom(s,(JSAtom *)(lVar10 + -4 + (long)pJVar5));
              }
              if (iVar2 != 0) goto LAB_0013ece1;
              iVar2 = bc_get_atom(s,(JSAtom *)((long)&pJVar5->u + lVar10));
              if (iVar2 != 0) goto LAB_0013ece1;
              piVar8 = (int *)((long)local_48 + 1);
              lVar10 = lVar10 + 0x20;
            } while ((long)piVar8 < (long)*local_38);
          }
        }
        piVar1 = &m->star_export_entries_count;
        iVar2 = bc_get_leb128(s,(uint32_t *)piVar1);
        if (iVar2 == 0) {
          iVar2 = *piVar1;
          if ((long)iVar2 != 0) {
            m->star_export_entries_size = iVar2;
            pJVar6 = (JSStarExportEntry *)js_mallocz(ctx,(long)iVar2 << 2);
            m->star_export_entries = pJVar6;
            if (pJVar6 == (JSStarExportEntry *)0x0) goto LAB_0013ece1;
            if (0 < *piVar1) {
              lVar12 = 0;
              lVar10 = 0;
              do {
                iVar2 = bc_get_leb128(s,(uint32_t *)
                                        ((long)&m->star_export_entries->req_module_idx + lVar12));
                if (iVar2 != 0) goto LAB_0013ece1;
                lVar10 = lVar10 + 1;
                lVar12 = lVar12 + 4;
              } while (lVar10 < *piVar1);
            }
          }
          piVar1 = &m->import_entries_count;
          iVar2 = bc_get_leb128(s,(uint32_t *)piVar1);
          if (iVar2 == 0) {
            iVar2 = *piVar1;
            if ((long)iVar2 != 0) {
              m->import_entries_size = iVar2;
              pJVar7 = (JSImportEntry *)js_mallocz(ctx,(long)iVar2 * 0xc);
              m->import_entries = pJVar7;
              if (pJVar7 == (JSImportEntry *)0x0) goto LAB_0013ece1;
              if (0 < *piVar1) {
                lVar12 = 0;
                lVar10 = 0;
                local_48 = piVar1;
                do {
                  pJVar7 = m->import_entries;
                  iVar2 = bc_get_leb128(s,(uint32_t *)((long)&pJVar7->var_idx + lVar12));
                  if (iVar2 != 0) goto LAB_0013ece1;
                  iVar2 = bc_get_atom(s,(JSAtom *)((long)&pJVar7->import_name + lVar12));
                  if (iVar2 != 0) goto LAB_0013ece1;
                  iVar2 = bc_get_leb128(s,(uint32_t *)((long)&pJVar7->req_module_idx + lVar12));
                  if (iVar2 != 0) goto LAB_0013ece1;
                  lVar10 = lVar10 + 1;
                  lVar12 = lVar12 + 0xc;
                } while (lVar10 < *local_48);
              }
            }
            JVar14 = JS_ReadObjectRec(s);
            m->func_obj = JVar14;
            if ((int)JVar14.tag != 6) {
              uVar9 = (ulong)m & 0xffffffff00000000;
              uVar3 = (ulong)m & 0xffffffff;
              iVar13 = -3;
              goto LAB_0013ecfb;
            }
          }
        }
      }
    }
  }
  else {
LAB_0013ecde:
    m = (JSModuleDef *)0x0;
  }
LAB_0013ece1:
  iVar13 = 6;
  if (m != (JSModuleDef *)0x0) {
    js_free_module_def(ctx,m);
  }
  uVar3 = 0;
  uVar9 = 0;
LAB_0013ecfb:
  JVar14.u.ptr = (void *)(uVar3 | uVar9);
  JVar14.tag = iVar13;
  return JVar14;
}

Assistant:

static JSValue JS_ReadModule(BCReaderState *s)
{
    JSContext *ctx = s->ctx;
    JSValue obj;
    JSModuleDef *m = NULL;
    JSAtom module_name;
    int i;
    uint8_t v8;
    
    if (bc_get_atom(s, &module_name))
        goto fail;
#ifdef DUMP_READ_OBJECT
    bc_read_trace(s, "name: "); print_atom(s->ctx, module_name); printf("\n");
#endif
    m = js_new_module_def(ctx, module_name);
    if (!m)
        goto fail;
    obj = JS_DupValue(ctx, JS_MKPTR(JS_TAG_MODULE, m));
    if (bc_get_leb128_int(s, &m->req_module_entries_count))
        goto fail;
    if (m->req_module_entries_count != 0) {
        m->req_module_entries_size = m->req_module_entries_count;
        m->req_module_entries = js_mallocz(ctx, sizeof(m->req_module_entries[0]) * m->req_module_entries_size);
        if (!m->req_module_entries)
            goto fail;
        for(i = 0; i < m->req_module_entries_count; i++) {
            JSReqModuleEntry *rme = &m->req_module_entries[i];
            if (bc_get_atom(s, &rme->module_name))
                goto fail;
        }
    }

    if (bc_get_leb128_int(s, &m->export_entries_count))
        goto fail;
    if (m->export_entries_count != 0) {
        m->export_entries_size = m->export_entries_count;
        m->export_entries = js_mallocz(ctx, sizeof(m->export_entries[0]) * m->export_entries_size);
        if (!m->export_entries)
            goto fail;
        for(i = 0; i < m->export_entries_count; i++) {
            JSExportEntry *me = &m->export_entries[i];
            if (bc_get_u8(s, &v8))
                goto fail;
            me->export_type = v8;
            if (me->export_type == JS_EXPORT_TYPE_LOCAL) {
                if (bc_get_leb128_int(s, &me->u.local.var_idx))
                    goto fail;
            } else {
                if (bc_get_leb128_int(s, &me->u.req_module_idx))
                    goto fail;
                if (bc_get_atom(s, &me->local_name))
                    goto fail;
            }
            if (bc_get_atom(s, &me->export_name))
                goto fail;
        }
    }

    if (bc_get_leb128_int(s, &m->star_export_entries_count))
        goto fail;
    if (m->star_export_entries_count != 0) {
        m->star_export_entries_size = m->star_export_entries_count;
        m->star_export_entries = js_mallocz(ctx, sizeof(m->star_export_entries[0]) * m->star_export_entries_size);
        if (!m->star_export_entries)
            goto fail;
        for(i = 0; i < m->star_export_entries_count; i++) {
            JSStarExportEntry *se = &m->star_export_entries[i];
            if (bc_get_leb128_int(s, &se->req_module_idx))
                goto fail;
        }
    }

    if (bc_get_leb128_int(s, &m->import_entries_count))
        goto fail;
    if (m->import_entries_count != 0) {
        m->import_entries_size = m->import_entries_count;
        m->import_entries = js_mallocz(ctx, sizeof(m->import_entries[0]) * m->import_entries_size);
        if (!m->import_entries)
            goto fail;
        for(i = 0; i < m->import_entries_count; i++) {
            JSImportEntry *mi = &m->import_entries[i];
            if (bc_get_leb128_int(s, &mi->var_idx))
                goto fail;
            if (bc_get_atom(s, &mi->import_name))
                goto fail;
            if (bc_get_leb128_int(s, &mi->req_module_idx))
                goto fail;
        }
    }

    m->func_obj = JS_ReadObjectRec(s);
    if (JS_IsException(m->func_obj))
        goto fail;
    return obj;
 fail:
    if (m) {
        js_free_module_def(ctx, m);
    }
    return JS_EXCEPTION;
}